

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Symbol __thiscall google::protobuf::DescriptorPool::Tables::FindSymbol(Tables *this,string_view key)

{
  SymbolsByNameSet *this_00;
  ctrl_t *pcVar1;
  size_t sVar2;
  uint uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 *puVar6;
  bool bVar7;
  ushort uVar8;
  Symbol *key_1;
  MixingHashState MVar9;
  slot_type *psVar10;
  undefined7 extraout_var;
  anon_union_8_1_a8a14541_for_iterator_2 aVar11;
  Symbol SVar12;
  reference pSVar13;
  slot_type *extraout_RDX;
  slot_type *extraout_RDX_00;
  slot_type *slot;
  FullNameQuery *b;
  FullNameQuery *b_00;
  slot_type *extraout_RDX_01;
  slot_type *psVar14;
  undefined1 uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 (*pauVar18) [16];
  uint uVar19;
  uint64_t v;
  FullNameQuery *pFVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  iterator iVar24;
  const_iterator it;
  __m128i match;
  size_t hash_of_arg;
  ulong local_d0;
  FullNameQuery local_c0;
  ulong local_b0;
  ulong local_a8;
  anon_class_24_3_2b146c49 local_a0;
  anon_class_24_3_2b146c49 local_88;
  ctrl_t *local_68;
  anon_union_8_1_a8a14541_for_iterator_2 local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  ctrl_t local_48;
  ctrl_t cStack_47;
  ctrl_t cStack_46;
  ctrl_t cStack_45;
  ctrl_t cStack_44;
  ctrl_t cStack_43;
  ctrl_t cStack_42;
  ctrl_t cStack_41;
  ctrl_t cStack_40;
  ctrl_t cStack_3f;
  ctrl_t cStack_3e;
  ctrl_t cStack_3d;
  ctrl_t cStack_3c;
  ctrl_t cStack_3b;
  ctrl_t cStack_3a;
  ctrl_t cStack_39;
  ulong local_38;
  
  local_c0.query._M_str = key._M_str;
  pFVar20 = (FullNameQuery *)key._M_len;
  this_00 = &this->symbols_by_name_;
  local_c0.query._M_len = (size_t)pFVar20;
  if (1 < (this->symbols_by_name_).
          super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    MVar9 = absl::lts_20240722::hash_internal::MixingHashState::combine_contiguous
                      ((MixingHashState)&absl::lts_20240722::hash_internal::MixingHashState::kSeed,
                       (uchar *)local_c0.query._M_str,(size_t)pFVar20);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = (byte *)((long)&(pFVar20->query)._M_len + MVar9.state_);
    local_38 = SUB168(auVar21 * ZEXT816(0x9ddfea08eb382d69),8) ^
               SUB168(auVar21 * ZEXT816(0x9ddfea08eb382d69),0);
    local_a0.hash_of_arg = &local_38;
    local_a0.key = &local_c0;
    uVar16 = (this_00->
             super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
             ).settings_.
             super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
             capacity_;
    local_a0.this =
         &this_00->
          super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
    ;
    if (uVar16 == 1) {
      psVar10 = absl::lts_20240722::container_internal::
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                ::soo_slot(&this_00->
                            super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                          );
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
      ::AssertHashEqConsistent<google::protobuf::(anonymous_namespace)::FullNameQuery>::
      anon_class_24_3_2b146c49::operator()(&local_a0,(ctrl_t *)psVar10,slot);
    }
    else {
      if (uVar16 == 0) goto LAB_00207160;
      if (uVar16 < 0x11) {
        psVar10 = absl::lts_20240722::container_internal::
                  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                  ::slot_array(&this_00->
                                super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                              );
        local_88.hash_of_arg = local_a0.hash_of_arg;
        local_88.key = local_a0.key;
        local_88.this = local_a0.this;
        uVar16 = (this->symbols_by_name_).
                 super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                 .settings_.
                 super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
        pauVar18 = (undefined1 (*) [16])
                   (this->symbols_by_name_).
                   super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                   value.heap_or_soo_.heap.control;
        if (uVar16 < 0xf) {
          if (8 < uVar16) {
            __assert_fail("cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x753,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::Symbol, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                         );
          }
          uVar16 = *(ulong *)(*pauVar18 + uVar16) & 0x8080808080808080;
          if (uVar16 != 0x8080808080808080) {
            uVar16 = uVar16 ^ 0x8080808080808080;
            psVar14 = extraout_RDX;
            do {
              lVar4 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
                }
              }
              absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
              ::AssertHashEqConsistent<google::protobuf::(anonymous_namespace)::FullNameQuery>::
              anon_class_24_3_2b146c49::operator()
                        (&local_88,
                         (ctrl_t *)((long)&psVar10[-1].ptr_ + (ulong)((uint)lVar4 & 0xfffffff8)),
                         psVar14);
              uVar16 = uVar16 & uVar16 - 1;
              psVar14 = extraout_RDX_00;
            } while (uVar16 != 0);
          }
        }
        else {
          uVar16 = (this->symbols_by_name_).
                   super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                   value.size_;
          uVar17 = uVar16 >> 1;
          if (1 < uVar16) {
            psVar14 = extraout_RDX;
            uVar16 = uVar17;
            while( true ) {
              auVar21 = *pauVar18;
              uVar19 = (uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(byte)(auVar21[0xf] >> 7) << 0xf);
              if (uVar19 != 0xffff) {
                uVar19 = ~uVar19;
                do {
                  uVar3 = 0;
                  if (uVar19 != 0) {
                    for (; (uVar19 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                    }
                  }
                  if ((char)(*pauVar18)[uVar3] < '\0') {
                    __assert_fail("IsFull(ctrl[i]) && \"hash table was modified unexpectedly\"",
                                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                                  ,0x764,
                                  "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::Symbol, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                                 );
                  }
                  absl::lts_20240722::container_internal::
                  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                  ::AssertHashEqConsistent<google::protobuf::(anonymous_namespace)::FullNameQuery>::
                  anon_class_24_3_2b146c49::operator()
                            (&local_88,(ctrl_t *)(psVar10 + uVar3),psVar14);
                  uVar16 = uVar16 - 1;
                  uVar8 = (ushort)(uVar19 - 1) & (ushort)uVar19;
                  uVar19 = CONCAT22((short)(uVar19 - 1 >> 0x10),uVar8);
                  psVar14 = extraout_RDX_01;
                } while (uVar8 != 0);
              }
              if (uVar16 == 0) break;
              psVar10 = psVar10 + 0x10;
              puVar6 = *pauVar18;
              pauVar18 = pauVar18 + 1;
              if (puVar6[0xf] == -1) {
                __assert_fail("(remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x76b,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::Symbol, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                             );
              }
            }
          }
          if (uVar17 < (this->symbols_by_name_).
                       super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                       .settings_.
                       super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                       .value.size_ >> 1) {
            __assert_fail("original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x770,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::Symbol, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                         );
          }
        }
      }
    }
  }
  sVar2 = (this_00->
          super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
          ).settings_.
          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  if (sVar2 != 1) {
    if (sVar2 != 0) {
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
      ::prefetch_heap_block
                (&this_00->
                  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                );
      pFVar20 = (FullNameQuery *)local_c0.query._M_len;
      MVar9 = absl::lts_20240722::hash_internal::MixingHashState::combine_contiguous
                        ((MixingHashState)&absl::lts_20240722::hash_internal::MixingHashState::kSeed
                         ,(uchar *)local_c0.query._M_str,local_c0.query._M_len);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (byte *)((long)&(pFVar20->query)._M_len + MVar9.state_);
      uVar16 = (this_00->
               super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
               ).settings_.
               super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
               value.capacity_;
      if (uVar16 == 1) {
        __assert_fail("!is_soo()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xdb0,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::(anonymous namespace)::FullNameQuery]"
                     );
      }
      if (uVar16 != 0) {
        if ((uVar16 + 1 & uVar16) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x145,
                        "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                       );
        }
        uVar17 = SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),8) ^
                 SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),0);
        local_d0 = (uVar17 >> 7 ^
                   (ulong)(this->symbols_by_name_).
                          super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                          .settings_.
                          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                          .value.heap_or_soo_.heap.control >> 0xc) & uVar16;
        local_a8 = uVar16;
        local_68 = absl::lts_20240722::container_internal::
                   raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                   ::control(&this_00->
                              super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                            );
        uVar15 = (undefined1)uVar17;
        auVar21 = ZEXT216(CONCAT11(uVar15,uVar15) & 0x7f7f);
        auVar21 = pshuflw(auVar21,auVar21,0);
        local_58 = auVar21._0_4_;
        uVar16 = 0;
        uStack_54 = local_58;
        uStack_50 = local_58;
        uStack_4c = local_58;
        do {
          pcVar1 = local_68 + local_d0;
          local_48 = *pcVar1;
          cStack_47 = pcVar1[1];
          cStack_46 = pcVar1[2];
          cStack_45 = pcVar1[3];
          cStack_44 = pcVar1[4];
          cStack_43 = pcVar1[5];
          cStack_42 = pcVar1[6];
          cStack_41 = pcVar1[7];
          cStack_40 = pcVar1[8];
          cStack_3f = pcVar1[9];
          cStack_3e = pcVar1[10];
          cStack_3d = pcVar1[0xb];
          cStack_3c = pcVar1[0xc];
          cStack_3b = pcVar1[0xd];
          cStack_3a = pcVar1[0xe];
          cStack_39 = pcVar1[0xf];
          auVar22[0] = -((ctrl_t)local_58 == local_48);
          auVar22[1] = -(local_58._1_1_ == cStack_47);
          auVar22[2] = -(local_58._2_1_ == cStack_46);
          auVar22[3] = -(local_58._3_1_ == cStack_45);
          auVar22[4] = -((ctrl_t)uStack_54 == cStack_44);
          auVar22[5] = -(uStack_54._1_1_ == cStack_43);
          auVar22[6] = -(uStack_54._2_1_ == cStack_42);
          auVar22[7] = -(uStack_54._3_1_ == cStack_41);
          auVar22[8] = -((ctrl_t)uStack_50 == cStack_40);
          auVar22[9] = -(uStack_50._1_1_ == cStack_3f);
          auVar22[10] = -(uStack_50._2_1_ == cStack_3e);
          auVar22[0xb] = -(uStack_50._3_1_ == cStack_3d);
          auVar22[0xc] = -((ctrl_t)uStack_4c == cStack_3c);
          auVar22[0xd] = -(uStack_4c._1_1_ == cStack_3b);
          auVar22[0xe] = -(uStack_4c._2_1_ == cStack_3a);
          auVar22[0xf] = -(uStack_4c._3_1_ == cStack_39);
          uVar8 = (ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar22[0xf] >> 7) << 0xf;
          uVar19 = (uint)uVar8;
          local_b0 = uVar16;
          while( true ) {
            iVar24.field_1 =
                 (anon_union_8_1_a8a14541_for_iterator_2)
                 (anon_union_8_1_a8a14541_for_iterator_2)local_60.slot_;
            iVar24.ctrl_ = (ctrl_t *)pFVar20;
            if (uVar8 == 0) break;
            uVar3 = 0;
            if (uVar19 != 0) {
              for (; (uVar19 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
              }
            }
            psVar10 = absl::lts_20240722::container_internal::
                      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                      ::slot_array(&this_00->
                                    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                                  );
            uVar16 = uVar3 + local_d0 & local_a8;
            bVar7 = (anonymous_namespace)::SymbolByFullNameEq::operator()
                              (psVar10 + uVar16,(Symbol *)&local_c0,b);
            if (bVar7) {
              iVar24 = absl::lts_20240722::container_internal::
                       raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                       ::iterator_at(&this_00->
                                      super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                                     ,uVar16);
              break;
            }
            uVar8 = (ushort)(uVar19 - 1) & (ushort)uVar19;
            uVar19 = CONCAT22((short)(uVar19 - 1 >> 0x10),uVar8);
          }
          local_60 = iVar24.field_1;
          pFVar20 = (FullNameQuery *)iVar24.ctrl_;
          uVar16 = local_b0;
          if (uVar8 != 0) {
            bVar7 = false;
          }
          else {
            auVar23[0] = -(local_48 == kEmpty);
            auVar23[1] = -(cStack_47 == kEmpty);
            auVar23[2] = -(cStack_46 == kEmpty);
            auVar23[3] = -(cStack_45 == kEmpty);
            auVar23[4] = -(cStack_44 == kEmpty);
            auVar23[5] = -(cStack_43 == kEmpty);
            auVar23[6] = -(cStack_42 == kEmpty);
            auVar23[7] = -(cStack_41 == kEmpty);
            auVar23[8] = -(cStack_40 == kEmpty);
            auVar23[9] = -(cStack_3f == kEmpty);
            auVar23[10] = -(cStack_3e == kEmpty);
            auVar23[0xb] = -(cStack_3d == kEmpty);
            auVar23[0xc] = -(cStack_3c == kEmpty);
            auVar23[0xd] = -(cStack_3b == kEmpty);
            auVar23[0xe] = -(cStack_3a == kEmpty);
            auVar23[0xf] = -(cStack_39 == kEmpty);
            if ((((((((((((((((auVar23 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                             (auVar23 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar23 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar23 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar23 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar23 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar23 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar23 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar23 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar23 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar23 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar23 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar23 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar23 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar23 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar23[0xf]) {
              uVar16 = (this_00->
                       super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                       ).settings_.
                       super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                       .value.capacity_;
              if (uVar16 == 0) goto LAB_00207160;
              if (uVar16 < local_b0 + 0x10) {
                __assert_fail("seq.index() <= capacity() && \"full table!\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0xdbd,
                              "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::(anonymous namespace)::FullNameQuery]"
                             );
              }
              local_d0 = local_b0 + local_d0 + 0x10 & local_a8;
              bVar7 = true;
              uVar16 = local_b0 + 0x10;
            }
            else {
              pFVar20 = (FullNameQuery *)0x0;
              bVar7 = false;
            }
          }
          aVar11 = local_60;
        } while (bVar7);
        goto LAB_0020707d;
      }
    }
LAB_00207160:
    __assert_fail("!kEnabled || cap >= kCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb37,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                 );
  }
  aVar11 = (anon_union_8_1_a8a14541_for_iterator_2)0x1;
  if (1 < (this->symbols_by_name_).
          super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    psVar10 = absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
              ::soo_slot(&this_00->
                          super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                        );
    aVar11._0_1_ = (anonymous_namespace)::SymbolByFullNameEq::operator()
                             (psVar10,(Symbol *)&local_c0,b_00);
    aVar11._1_7_ = extraout_var;
    if (aVar11._0_1_) {
      aVar11.slot_ = absl::lts_20240722::container_internal::
                     raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                     ::soo_slot(&this_00->
                                 super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                               );
      pFVar20 = (FullNameQuery *)&absl::lts_20240722::container_internal::kSooControl;
      goto LAB_0020707d;
    }
  }
  pFVar20 = (FullNameQuery *)0x0;
LAB_0020707d:
  local_a0.key = (FullNameQuery *)0x0;
  local_88.key = pFVar20;
  local_88.this =
       (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
        *)aVar11;
  bVar7 = absl::lts_20240722::container_internal::operator==
                    ((iterator *)&local_88,(iterator *)&local_a0);
  if (bVar7) {
    SVar12.ptr_ = (SymbolBase *)&Symbol::Symbol()::null_symbol;
  }
  else {
    pSVar13 = absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
              ::iterator::operator*((iterator *)&local_88);
    SVar12.ptr_ = pSVar13->ptr_;
  }
  return (Symbol)SVar12.ptr_;
}

Assistant:

inline Symbol DescriptorPool::Tables::FindSymbol(absl::string_view key) const {
  auto it = symbols_by_name_.find(FullNameQuery{key});
  return it == symbols_by_name_.end() ? Symbol() : *it;
}